

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::Event::Event(Event *this,string_view name)

{
  string_view local_18;
  
  local_18.size_ = name.size_;
  local_18.data_ = name.data_;
  string_view::to_string_abi_cxx11_(&this->name,&local_18);
  FuncDeclaration::FuncDeclaration(&this->decl);
  return;
}

Assistant:

explicit Event(string_view name) : name(name.to_string()) {}